

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::
ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::connected(ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
            *this,error_code *e,
           shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *h)

{
  _Any_data *p_Var1;
  _Bind<void_(libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::*(libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  local_38;
  ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *local_10;
  
  if (e->failed_ != true) {
    local_38._M_f =
         (offset_in_ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_to_subr
          )handshake;
    local_38._8_8_ = 0;
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
    ._M_head_impl.
    super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (h->
              super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
    ._M_head_impl.
    super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (h->
         super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if (local_38._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
        ._M_head_impl.
        super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38._M_bound_args.
         super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
         ._M_head_impl.
         super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_38._M_bound_args.
              super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
              ._M_head_impl.
              super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38._M_bound_args.
         super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
         .
         super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
         ._M_head_impl.
         super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_38._M_bound_args.
              super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
              .
              super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
              ._M_head_impl.
              super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
    .
    super__Head_base<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_false>
    ._M_head_impl = this;
    local_10 = this;
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::initiate_async_handshake::operator()(&local_10,&local_38,client);
    if (local_38._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
        .
        super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
        ._M_head_impl.
        super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._M_bound_args.
                 super__Tuple_impl<0UL,_libtorrent::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
                 .
                 super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
                 .
                 super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
                 .
                 super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
                 ._M_head_impl.
                 super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  p_Var1 = (_Any_data *)
           (h->
           super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (*(long *)(p_Var1 + 1) != 0) {
    (**(code **)((long)p_Var1 + 0x18))(p_Var1,e);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void connected(error_code const& e, std::shared_ptr<handler_type> h)
	{
		if (e)
		{
			(*h)(e);
			return;
		}

		using std::placeholders::_1;
		m_sock.async_handshake(ssl::stream_base::client
			, std::bind(&ssl_stream::handshake, this, _1, h));
	}